

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetStateCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *P)

{
  long lVar1;
  MatrixDynSize *pMVar2;
  MatrixDynSize *in_RSI;
  long *in_RDI;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  if ((lVar1 == *in_RDI) && (lVar1 = iDynTree::MatrixDynSize::cols(), lVar1 == *in_RDI)) {
    pMVar2 = (MatrixDynSize *)
             iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x2c),in_RSI);
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x27),pMVar2);
    *(undefined1 *)((long)in_RDI + 0x1db) = 1;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetStateCovariance",
             "Could not set KF initial state covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetStateCovariance(const iDynTree::MatrixDynSize& P)
{
    if ( (P.rows() != m_dim_X) || (P.cols() != m_dim_X))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetStateCovariance", "Could not set KF initial state covariance - dimension mismatch");
        return false;
    }

    m_P = m_P0 = P;
    m_initial_state_covariance_set = true;
    return true;
}